

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O3

X509 * X509_parse_from_buffer(CRYPTO_BUFFER *buf)

{
  uint8_t *puVar1;
  X509 *a;
  CBS cbs;
  CBS local_20;
  
  puVar1 = CRYPTO_BUFFER_data(buf);
  local_20.len = CRYPTO_BUFFER_len(buf);
  local_20.data = puVar1;
  a = (X509 *)x509_parse(&local_20,buf);
  if (a != (X509 *)0x0) {
    if (local_20.len == 0) {
      return (X509 *)a;
    }
    X509_free(a);
  }
  return (X509 *)0x0;
}

Assistant:

X509 *X509_parse_from_buffer(CRYPTO_BUFFER *buf) {
  CBS cbs;
  CBS_init(&cbs, CRYPTO_BUFFER_data(buf), CRYPTO_BUFFER_len(buf));
  X509 *ret = x509_parse(&cbs, buf);
  if (ret == NULL || CBS_len(&cbs) != 0) {
    X509_free(ret);
    return NULL;
  }

  return ret;
}